

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseProtocol.cpp
# Opt level: O2

uint16_t tonk::protocol::CalculateFuzzyNATPort(uint16_t externalPort,PCGRandom *portPrng)

{
  int iVar1;
  uint uVar2;
  uint16_t uVar3;
  uint32_t uVar4;
  uint uVar5;
  uint uVar6;
  undefined6 in_register_0000003a;
  
  uVar4 = siamese::PCGRandom::Next(portPrng);
  uVar5 = uVar4 & 0xff;
  iVar1 = (int)CONCAT62(in_register_0000003a,externalPort);
  uVar6 = (uVar5 - 0x80) + iVar1;
  uVar2 = (uVar5 - 0x100) + iVar1;
  if (uVar6 < 0x10000) {
    uVar2 = uVar6;
  }
  uVar3 = (uint16_t)uVar2;
  if (uVar5 + iVar1 < 0x81) {
    uVar3 = (uint16_t)(uVar5 + iVar1);
  }
  return uVar3;
}

Assistant:

uint16_t CalculateFuzzyNATPort(uint16_t externalPort, siamese::PCGRandom& portPrng)
{
    TONK_DEBUG_ASSERT(externalPort != 0);

    int port = externalPort;
    port -= kNATFuzzyPortRange;
    port += portPrng.Next() % (kNATFuzzyPortRange * 2);
    if (port <= 0) {
        port += kNATFuzzyPortRange;
    }
    else if (port >= 65536) {
        port -= kNATFuzzyPortRange;
    }
    return static_cast<uint16_t>(port);
}